

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameTypes.cpp
# Opt level: O0

Pass * wasm::createNameTypesPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  NameTypes::NameTypes((NameTypes *)this);
  return this;
}

Assistant:

Pass* createNameTypesPass() { return new NameTypes(); }